

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Counter.cpp
# Opt level: O2

void __thiscall
Counter::Reset(Counter *this,shared_ptr<myvk::CommandPool> *command_pool,uint32_t value)

{
  element_type *this_00;
  shared_ptr<myvk::Fence> *fence;
  initializer_list<VkBufferCopy> __l;
  allocator_type local_81;
  shared_ptr<myvk::CommandBuffer> command_buffer;
  Ptr<BufferBase> local_70;
  Ptr<BufferBase> local_60;
  _Vector_base<VkBufferCopy,_std::allocator<VkBufferCopy>_> local_50;
  VkBufferCopy local_38;
  
  myvk::CommandBuffer::Create
            ((CommandBuffer *)&command_buffer,command_pool,VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  local_50._M_impl.super__Vector_impl_data._M_start._0_4_ = value;
  myvk::Buffer::UpdateData<unsigned_int>
            ((this->m_staging_buffer).super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr,(uint *)&local_50,0);
  myvk::CommandBuffer::Begin
            (command_buffer.super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr,1);
  this_00 = command_buffer.super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  std::__shared_ptr<myvk::BufferBase,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<myvk::Buffer,void>
            ((__shared_ptr<myvk::BufferBase,(__gnu_cxx::_Lock_policy)2> *)&local_60,
             &(this->m_staging_buffer).super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>)
  ;
  std::__shared_ptr<myvk::BufferBase,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<myvk::Buffer,void>
            ((__shared_ptr<myvk::BufferBase,(__gnu_cxx::_Lock_policy)2> *)&local_70,
             (__shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2> *)this);
  local_38.srcOffset = 0;
  local_38.dstOffset = 0;
  local_38.size = 4;
  __l._M_len = 1;
  __l._M_array = &local_38;
  std::vector<VkBufferCopy,_std::allocator<VkBufferCopy>_>::vector
            ((vector<VkBufferCopy,_std::allocator<VkBufferCopy>_> *)&local_50,__l,&local_81);
  myvk::CommandBuffer::CmdCopy
            (this_00,&local_60,&local_70,
             (vector<VkBufferCopy,_std::allocator<VkBufferCopy>_> *)&local_50);
  std::_Vector_base<VkBufferCopy,_std::allocator<VkBufferCopy>_>::~_Vector_base(&local_50);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_70.super___shared_ptr<myvk::BufferBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_60.super___shared_ptr<myvk::BufferBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  myvk::CommandBuffer::End
            (command_buffer.super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr);
  fence = &this->m_fence;
  myvk::CommandBuffer::Submit
            (command_buffer.super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr,fence);
  myvk::Fence::Wait((fence->super___shared_ptr<myvk::Fence,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
                    0xffffffffffffffff);
  myvk::Fence::Reset((fence->super___shared_ptr<myvk::Fence,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&command_buffer.super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void Counter::Reset(const std::shared_ptr<myvk::CommandPool> &command_pool, uint32_t value) {
	std::shared_ptr<myvk::CommandBuffer> command_buffer = myvk::CommandBuffer::Create(command_pool);
	m_staging_buffer->UpdateData((uint32_t)value, 0);
	command_buffer->Begin(VK_COMMAND_BUFFER_USAGE_ONE_TIME_SUBMIT_BIT);
	command_buffer->CmdCopy(m_staging_buffer, m_buffer, {{0, 0, sizeof(uint32_t)}});
	command_buffer->End();
	command_buffer->Submit(m_fence);
	m_fence->Wait();
	m_fence->Reset();
}